

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O2

void __thiscall
tchecker::typed_clock_to_clock_assign_statement_t::typed_clock_to_clock_assign_statement_t
          (typed_clock_to_clock_assign_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_lvalue_expression_t> *lvalue,
          shared_ptr<const_tchecker::typed_lvalue_expression_t> *rvalue)

{
  bool bVar1;
  int iVar2;
  invalid_argument *this_00;
  shared_ptr<const_tchecker::typed_expression_t> sStack_38;
  
  *(undefined ***)&(this->super_typed_assign_statement_t).super_typed_statement_t =
       &PTR__statement_t_001f9728;
  std::__shared_ptr<tchecker::typed_expression_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_lvalue_expression_t_const,void>
            ((__shared_ptr<tchecker::typed_expression_t_const,(__gnu_cxx::_Lock_policy)2> *)
             &sStack_38,
             &rvalue->
              super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
            );
  typed_assign_statement_t::typed_assign_statement_t
            (&this->super_typed_assign_statement_t,&PTR_construction_vtable_56__001f7f78,type,lvalue
             ,&sStack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_38.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  *(undefined8 *)&(this->super_typed_assign_statement_t).super_typed_statement_t = 0x1f7ed0;
  *(undefined8 *)&(this->super_typed_assign_statement_t).super_assign_statement_t = 0x1f7f40;
  iVar2 = (**(code **)(*(long *)&((lvalue->
                                  super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->super_typed_expression_t + 0x38))();
  if (iVar2 == 1) {
    bVar1 = clock_assignable((((lvalue->
                               super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->super_typed_expression_t)._type);
    if (bVar1) {
      bVar1 = clock_valued((((rvalue->
                             super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->super_typed_expression_t)._type);
      if (bVar1) {
        return;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"rvalue is not clock valued");
    }
    else {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"lvalue is not an assignable clock");
    }
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"lvalue of size > 1 is not assignable");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typed_clock_to_clock_assign_statement_t::typed_clock_to_clock_assign_statement_t(
    enum tchecker::statement_type_t type, std::shared_ptr<tchecker::typed_lvalue_expression_t const> const & lvalue,
    std::shared_ptr<tchecker::typed_lvalue_expression_t const> const & rvalue)
    : tchecker::typed_assign_statement_t(type, lvalue, rvalue)
{
  if (lvalue->size() != 1)
    throw std::invalid_argument("lvalue of size > 1 is not assignable");
  if (!tchecker::clock_assignable(lvalue->type()))
    throw std::invalid_argument("lvalue is not an assignable clock");
  if (!tchecker::clock_valued(rvalue->type()))
    throw std::invalid_argument("rvalue is not clock valued");
}